

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

void loadFunction(LoadState *S,Proto *f,TString *psource)

{
  lu_byte lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  TString *pTVar5;
  Instruction *b;
  TValue *pTVar6;
  lua_Integer lVar7;
  Upvaldesc *pUVar8;
  Proto **ppPVar9;
  Proto *pPVar10;
  ls_byte *b_00;
  AbsLineInfo *pAVar11;
  LocVar *pLVar12;
  ulong uVar13;
  ulong uVar14;
  lua_Number lVar15;
  
  pTVar5 = loadStringN(S,f);
  if (pTVar5 != (TString *)0x0) {
    psource = pTVar5;
  }
  f->source = psource;
  iVar3 = loadInt(S);
  f->linedefined = iVar3;
  iVar3 = loadInt(S);
  f->lastlinedefined = iVar3;
  lVar1 = loadByte(S);
  f->numparams = lVar1;
  lVar1 = loadByte(S);
  f->is_vararg = lVar1;
  lVar1 = loadByte(S);
  f->maxstacksize = lVar1;
  iVar3 = loadInt(S);
  uVar13 = 0;
  b = (Instruction *)luaM_malloc_(S->L,(long)iVar3 * 4,0);
  f->code = b;
  f->sizecode = iVar3;
  loadBlock(S,b,(long)iVar3 * 4);
  uVar4 = loadInt(S);
  pTVar6 = (TValue *)luaM_malloc_(S->L,(long)(int)uVar4 << 4,0);
  f->k = pTVar6;
  f->sizek = uVar4;
  uVar14 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar14 = uVar13;
  }
  for (; uVar14 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
    (&pTVar6->tt_)[uVar13] = '\0';
  }
  uVar13 = 0;
  do {
    if (uVar14 * 0x10 == uVar13) {
      uVar4 = loadInt(S);
      uVar13 = 0;
      pUVar8 = (Upvaldesc *)luaM_malloc_(S->L,(long)(int)uVar4 << 4,0);
      f->upvalues = pUVar8;
      f->sizeupvalues = uVar4;
      uVar14 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar14 = uVar13;
      }
      for (; uVar14 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
        *(undefined8 *)((long)&pUVar8->name + uVar13) = 0;
      }
      for (uVar13 = 0; uVar14 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
        lVar1 = loadByte(S);
        (&f->upvalues->instack)[uVar13] = lVar1;
        lVar1 = loadByte(S);
        (&f->upvalues->idx)[uVar13] = lVar1;
        lVar1 = loadByte(S);
        (&f->upvalues->kind)[uVar13] = lVar1;
      }
      uVar4 = loadInt(S);
      uVar13 = 0;
      ppPVar9 = (Proto **)luaM_malloc_(S->L,(long)(int)uVar4 * 8,0);
      f->p = ppPVar9;
      f->sizep = uVar4;
      uVar14 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar14 = uVar13;
      }
      for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        f->p[uVar13] = (Proto *)0x0;
      }
      for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        pPVar10 = luaF_newproto(S->L);
        f->p[uVar13] = pPVar10;
        ppPVar9 = f->p;
        if (((f->marked & 0x20) != 0) && ((ppPVar9[uVar13]->marked & 0x18) != 0)) {
          luaC_barrier_(S->L,(GCObject *)f,(GCObject *)ppPVar9[uVar13]);
          ppPVar9 = f->p;
        }
        loadFunction(S,ppPVar9[uVar13],f->source);
      }
      iVar3 = loadInt(S);
      uVar13 = 0;
      b_00 = (ls_byte *)luaM_malloc_(S->L,(long)iVar3,0);
      f->lineinfo = b_00;
      f->sizelineinfo = iVar3;
      loadBlock(S,b_00,(long)iVar3);
      uVar4 = loadInt(S);
      pAVar11 = (AbsLineInfo *)luaM_malloc_(S->L,(long)(int)uVar4 * 8,0);
      f->abslineinfo = pAVar11;
      f->sizeabslineinfo = uVar4;
      uVar14 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar14 = uVar13;
      }
      while( true ) {
        uVar4 = loadInt(S);
        if (uVar14 == uVar13) break;
        f->abslineinfo[uVar13].pc = uVar4;
        iVar3 = loadInt(S);
        f->abslineinfo[uVar13].line = iVar3;
        uVar13 = uVar13 + 1;
      }
      uVar13 = 0;
      pLVar12 = (LocVar *)luaM_malloc_(S->L,(long)(int)uVar4 << 4,0);
      f->locvars = pLVar12;
      f->sizelocvars = uVar4;
      uVar14 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar14 = uVar13;
      }
      for (; uVar14 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
        *(undefined8 *)((long)&pLVar12->varname + uVar13) = 0;
      }
      for (uVar13 = 0; uVar14 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
        pTVar5 = loadStringN(S,f);
        *(TString **)((long)&f->locvars->varname + uVar13) = pTVar5;
        iVar3 = loadInt(S);
        *(int *)((long)&f->locvars->startpc + uVar13) = iVar3;
        iVar3 = loadInt(S);
        *(int *)((long)&f->locvars->endpc + uVar13) = iVar3;
      }
      iVar3 = loadInt(S);
      uVar14 = 0;
      uVar4 = 0;
      if (iVar3 != 0) {
        uVar4 = f->sizeupvalues;
      }
      uVar13 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar13 = uVar14;
      }
      for (; uVar13 * 0x10 != uVar14; uVar14 = uVar14 + 0x10) {
        pTVar5 = loadStringN(S,f);
        *(TString **)((long)&f->upvalues->name + uVar14) = pTVar5;
      }
      return;
    }
    pTVar6 = f->k;
    bVar2 = loadByte(S);
    if (bVar2 < 2) {
LAB_0014a8e4:
      (&pTVar6->tt_)[uVar13] = bVar2;
    }
    else {
      if (bVar2 == 3) {
        lVar7 = loadInteger(S);
        *(lua_Integer *)((long)&pTVar6->value_ + uVar13) = lVar7;
        bVar2 = 3;
        goto LAB_0014a8e4;
      }
      if (bVar2 == 4) {
LAB_0014a8b5:
        pTVar5 = loadStringN(S,f);
        if (pTVar5 == (TString *)0x0) {
          error(S,"bad format for constant string");
        }
        *(TString **)((long)&pTVar6->value_ + uVar13) = pTVar5;
        bVar2 = pTVar5->tt | 0x40;
        goto LAB_0014a8e4;
      }
      if (bVar2 == 0x11) goto LAB_0014a8e4;
      if (bVar2 == 0x14) goto LAB_0014a8b5;
      if (bVar2 == 0x13) {
        lVar15 = loadNumber(S);
        *(lua_Number *)((long)&pTVar6->value_ + uVar13) = lVar15;
        bVar2 = 0x13;
        goto LAB_0014a8e4;
      }
    }
    uVar13 = uVar13 + 0x10;
  } while( true );
}

Assistant:

static void loadFunction (LoadState *S, Proto *f, TString *psource) {
  f->source = loadStringN(S, f);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = loadInt(S);
  f->lastlinedefined = loadInt(S);
  f->numparams = loadByte(S);
  f->is_vararg = loadByte(S);
  f->maxstacksize = loadByte(S);
  loadCode(S, f);
  loadConstants(S, f);
  loadUpvalues(S, f);
  loadProtos(S, f);
  loadDebug(S, f);
}